

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

char * dedotdotify(char *input,size_t clen)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool local_5b;
  size_t oindex;
  size_t qlen;
  _Bool dotdot;
  char *queryp;
  char *orginput;
  char *outptr;
  char *out;
  size_t clen_local;
  char *input_local;
  
  pcVar2 = (char *)(*Curl_cmalloc)(clen + 1);
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  *pcVar2 = '\0';
  if (*input == '\0') {
    return pcVar2;
  }
  pcVar3 = strchr(input,0x3f);
  orginput = pcVar2;
  clen_local = (size_t)input;
  do {
    bVar7 = true;
    if (*(char *)clen_local == '.') {
      iVar1 = strncmp("./",(char *)clen_local,2);
      if (iVar1 == 0) {
        clen_local = clen_local + 2;
      }
      else {
        iVar1 = strncmp("../",(char *)clen_local,3);
        if (iVar1 == 0) {
          clen_local = clen_local + 3;
        }
        else {
          iVar1 = strcmp(".",(char *)clen_local);
          if ((((iVar1 == 0) || (iVar1 = strcmp("..",(char *)clen_local), iVar1 == 0)) ||
              (iVar1 = strncmp(".?",(char *)clen_local,2), iVar1 == 0)) ||
             (iVar1 = strncmp("..?",(char *)clen_local,3), iVar1 == 0)) {
            *pcVar2 = '\0';
            break;
          }
          bVar7 = false;
        }
      }
    }
    else if (*(char *)clen_local == '/') {
      iVar1 = strncmp("/./",(char *)clen_local,3);
      if (iVar1 == 0) {
        clen_local = clen_local + 2;
      }
      else {
        iVar1 = strcmp("/.",(char *)clen_local);
        if ((iVar1 == 0) || (iVar1 = strncmp("/.?",(char *)clen_local,3), iVar1 == 0)) {
          *orginput = '/';
          orginput[1] = '\0';
          orginput = orginput + 1;
          break;
        }
        iVar1 = strncmp("/../",(char *)clen_local,4);
        if (iVar1 == 0) {
          clen_local = clen_local + 3;
          do {
            if (orginput <= pcVar2) break;
            orginput = orginput + -1;
          } while (*orginput != '/');
          *orginput = '\0';
        }
        else {
          iVar1 = strcmp("/..",(char *)clen_local);
          if ((iVar1 == 0) || (iVar1 = strncmp("/..?",(char *)clen_local,4), iVar1 == 0))
          goto LAB_00a9da07;
          bVar7 = false;
        }
      }
    }
    else {
      bVar7 = false;
    }
    if (!bVar7) {
      do {
        pcVar5 = (char *)(clen_local + 1);
        pcVar6 = orginput + 1;
        *orginput = *(char *)clen_local;
        bVar7 = false;
        if ((*pcVar5 != '\0') && (bVar7 = false, *pcVar5 != '/')) {
          bVar7 = *pcVar5 != '?';
        }
        orginput = pcVar6;
        clen_local = (size_t)pcVar5;
      } while (bVar7);
      *pcVar6 = '\0';
    }
    local_5b = false;
    if (*(char *)clen_local != '\0') {
      local_5b = pcVar3 == (char *)0x0 || clen_local < pcVar3;
    }
  } while (local_5b);
  goto LAB_00a9db11;
  while (orginput = orginput + -1, *orginput != '/') {
LAB_00a9da07:
    if (orginput <= pcVar2) break;
  }
  *orginput = '/';
  orginput[1] = '\0';
  orginput = orginput + 1;
LAB_00a9db11:
  if (pcVar3 != (char *)0x0) {
    sVar4 = strlen(input + ((long)pcVar3 - (long)input));
    memcpy(orginput,input + ((long)pcVar3 - (long)input),sVar4 + 1);
  }
  return pcVar2;
}

Assistant:

UNITTEST char *dedotdotify(const char *input, size_t clen)
{
  char *out = malloc(clen + 1);
  char *outptr;
  const char *orginput = input;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  *out = 0; /* null-terminates, for inputs like "./" */
  outptr = out;

  if(!*input)
    /* zero length input string, return that */
    return out;

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(input, '?');

  do {
    bool dotdot = TRUE;
    if(*input == '.') {
      /*  A.  If the input buffer begins with a prefix of "../" or "./", then
          remove that prefix from the input buffer; otherwise, */

      if(!strncmp("./", input, 2)) {
        input += 2;
        clen -= 2;
      }
      else if(!strncmp("../", input, 3)) {
        input += 3;
        clen -= 3;
      }
      /*  D.  if the input buffer consists only of "." or "..", then remove
          that from the input buffer; otherwise, */

      else if(!strcmp(".", input) || !strcmp("..", input) ||
              !strncmp(".?", input, 2) || !strncmp("..?", input, 3)) {
        *out = 0;
        break;
      }
      else
        dotdot = FALSE;
    }
    else if(*input == '/') {
      /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(!strncmp("/./", input, 3)) {
        input += 2;
        clen -= 2;
      }
      else if(!strcmp("/.", input) || !strncmp("/.?", input, 3)) {
        *outptr++ = '/';
        *outptr = 0;
        break;
      }

      /*  C.  if the input buffer begins with a prefix of "/../" or "/..",
          where ".." is a complete path segment, then replace that prefix with
          "/" in the input buffer and remove the last segment and its
          preceding "/" (if any) from the output buffer; otherwise, */

      else if(!strncmp("/../", input, 4)) {
        input += 3;
        clen -= 3;
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr = 0; /* null-terminate where it stops */
      }
      else if(!strcmp("/..", input) || !strncmp("/..?", input, 4)) {
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr++ = '/';
        *outptr = 0; /* null-terminate where it stops */
        break;
      }
      else
        dotdot = FALSE;
    }
    else
      dotdot = FALSE;

    if(!dotdot) {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *input++;
        clen--;
      } while(*input && (*input != '/') && (*input != '?'));
      *outptr = 0;
    }

    /* continue until end of input string OR, if there is a terminating
       query part, stop there */
  } while(*input && (!queryp || (input < queryp)));

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. */
    size_t oindex = queryp - orginput;
    qlen = strlen(&orginput[oindex]);
    memcpy(outptr, &orginput[oindex], qlen + 1); /* include zero byte */
  }

  return out;
}